

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

string * __thiscall
CppGenerator::genPointerArrays
          (string *__return_storage_ptr__,CppGenerator *this,string *rel,string *numOfJoinVars,
          bool parallelizeRelation)

{
  string *this_00;
  undefined3 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if (CONCAT31(in_register_00000081,parallelizeRelation) == 0) {
    offset_abi_cxx11_(&local_a8,this,2);
    std::operator+(&local_288,&local_a8,"size_t lowerptr_");
    std::operator+(&local_268,&local_288,rel);
    std::operator+(&local_248,&local_268,"[");
    std::operator+(&local_228,&local_248,numOfJoinVars);
    std::operator+(&local_208,&local_228,"] = {}, ");
    std::operator+(&local_1e8,&local_208,"upperptr_");
    std::operator+(&local_1c8,&local_1e8,rel);
    std::operator+(&local_1a8,&local_1c8,"[");
    std::operator+(&local_188,&local_1a8,numOfJoinVars);
    std::operator+(&local_168,&local_188,"] = {}; \n");
    offset_abi_cxx11_(&bStack_2a8,this,2);
    std::operator+(&local_148,&local_168,&bStack_2a8);
    std::operator+(&local_128,&local_148,"upperptr_");
    std::operator+(&local_108,&local_128,rel);
    std::operator+(&local_e8,&local_108,"[0] = ");
    std::operator+(&local_c8,&local_e8,rel);
    std::operator+(__return_storage_ptr__,&local_c8,".size()-1;\n");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&bStack_2a8);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    this_00 = &local_a8;
  }
  else {
    offset_abi_cxx11_(&local_48,this,2);
    std::operator+(&bStack_2a8,&local_48,"size_t lowerptr_");
    std::operator+(&local_a8,&bStack_2a8,rel);
    std::operator+(&local_288,&local_a8,"[");
    std::operator+(&local_268,&local_288,numOfJoinVars);
    std::operator+(&local_248,&local_268,"] = {}, ");
    std::operator+(&local_228,&local_248,"upperptr_");
    std::operator+(&local_208,&local_228,rel);
    std::operator+(&local_1e8,&local_208,"[");
    std::operator+(&local_1c8,&local_1e8,numOfJoinVars);
    std::operator+(&local_1a8,&local_1c8,"] = {}; \n");
    offset_abi_cxx11_(&local_68,this,2);
    std::operator+(&local_188,&local_1a8,&local_68);
    std::operator+(&local_168,&local_188,"upperptr_");
    std::operator+(&local_148,&local_168,rel);
    std::operator+(&local_128,&local_148,"[0] = upperptr;\n");
    offset_abi_cxx11_(&local_88,this,2);
    std::operator+(&local_108,&local_128,&local_88);
    std::operator+(&local_e8,&local_108,"lowerptr_");
    std::operator+(&local_c8,&local_e8,rel);
    std::operator+(__return_storage_ptr__,&local_c8,"[0] = lowerptr;\n");
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&bStack_2a8);
    this_00 = &local_48;
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::string CppGenerator::genPointerArrays(const std::string& rel,
                                           std::string& numOfJoinVars,
                                           bool parallelizeRelation)
{
    if (parallelizeRelation)
        return offset(2)+"size_t lowerptr_"+rel+"["+numOfJoinVars+"] = {}, "+
            "upperptr_"+rel+"["+numOfJoinVars+"] = {}; \n"+
            offset(2)+"upperptr_"+rel+"[0] = upperptr;\n"+
            offset(2)+"lowerptr_"+rel+"[0] = lowerptr;\n";
    else
        return offset(2)+"size_t lowerptr_"+rel+"["+numOfJoinVars+"] = {}, "+
            "upperptr_"+rel+"["+numOfJoinVars+"] = {}; \n"+
            offset(2)+"upperptr_"+rel+"[0] = "+rel+".size()-1;\n";
}